

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::Psbt::AddTxIn(Psbt *this,Txid *txid,uint32_t vout,uint32_t sequence)

{
  uint32_t uVar1;
  void *pvVar2;
  uchar *puVar3;
  size_type sVar4;
  CfdException *pCVar5;
  Transaction local_138;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0;
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0;
  CfdSourceLocation local_90;
  int local_78 [2];
  int ret;
  ByteData local_68;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> txhash;
  wally_tx_input *input;
  uint32_t index;
  wally_psbt *psbt_pointer;
  uint32_t sequence_local;
  uint32_t vout_local;
  Txid *txid_local;
  Psbt *this_local;
  
  pvVar2 = this->wally_psbt_pointer_;
  uVar1 = *(uint32_t *)((long)pvVar2 + 0x18);
  txhash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Txid::GetData(&local_68,txid);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,&local_68);
  ByteData::~ByteData(&local_68);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  local_78[0] = wally_tx_input_init_alloc
                          (puVar3,sVar4,vout,sequence,0,0,0,
                           &txhash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_78[0] != 0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x89a;
    local_90.funcname = "AddTxIn";
    logger::warn<int&>(&local_90,"wally_tx_input_init_alloc NG[{}]",local_78);
    local_b2 = 1;
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_b0,"psbt alloc input error.",&local_b1);
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_b0);
    local_b2 = 0;
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_78[0] = wally_psbt_add_input_at
                          (pvVar2,uVar1,1,
                           txhash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  wally_tx_input_free(txhash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_78[0] != 0) {
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x8a2;
    local_d0.funcname = "AddTxIn";
    logger::warn<int&>(&local_d0,"wally_psbt_add_input_at NG[{}]",local_78);
    local_f2 = 1;
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_f0,"psbt add input error.",&local_f1);
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_f0);
    local_f2 = 0;
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  RebuildTransaction(&local_138,this->wally_psbt_pointer_);
  Transaction::operator=(&this->base_tx_,&local_138);
  Transaction::~Transaction(&local_138);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  return uVar1;
}

Assistant:

uint32_t Psbt::AddTxIn(const Txid &txid, uint32_t vout, uint32_t sequence) {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  uint32_t index = static_cast<uint32_t>(psbt_pointer->num_inputs);
  struct wally_tx_input *input = nullptr;
  std::vector<uint8_t> txhash = txid.GetData().GetBytes();

  int ret = wally_tx_input_init_alloc(
      txhash.data(), txhash.size(), vout, sequence, nullptr, 0, nullptr,
      &input);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_input_init_alloc NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt alloc input error.");
  }

  ret = wally_psbt_add_input_at(
      psbt_pointer, index, WALLY_PSBT_FLAG_NON_FINAL, input);
  wally_tx_input_free(input);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_add_input_at NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt add input error.");
  }
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
  return index;
}